

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

int SoapySDRDevice_setReferenceClockRate(SoapySDRDevice *device,double rate)

{
  undefined1 *puVar1;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x250))(rate,device);
  return 0;
}

Assistant:

int SoapySDRDevice_setReferenceClockRate(SoapySDRDevice *device, const double rate)
{
    __SOAPY_SDR_C_TRY
    device->setReferenceClockRate(rate);
    __SOAPY_SDR_C_CATCH
}